

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O3

void __thiscall streams_tests::streams_buffered_file::test_method(streams_buffered_file *this)

{
  long lVar1;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  FILE *__stream;
  int iVar2;
  FILE *file_00;
  size_t in_RCX;
  size_t sVar3;
  ulong uVar4;
  char cVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  _func_int **pp_Var8;
  long in_FS_OFFSET;
  bool bVar9;
  readonly_property<bool> rVar10;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  check_type cVar11;
  undefined8 in_stack_fffffffffffff828;
  undefined8 in_stack_fffffffffffff830;
  pointer in_stack_fffffffffffff838;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  undefined1 *local_708;
  undefined1 *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  undefined1 *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_688;
  char *local_680;
  undefined1 *local_678;
  undefined1 *local_670;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 local_2d4 [4];
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 local_290 [16];
  undefined1 *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  uint8_t i;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  BufferedFile bfbad;
  uint8_t obj_4;
  _func_int *local_158;
  _func_int **local_150;
  char *local_148;
  assertion_result local_140;
  uint8_t obj_9;
  undefined1 local_120 [8];
  assertion_result local_118;
  _func_int **local_100;
  uint8_t obj;
  bool local_f0;
  undefined1 *local_e8;
  lazy_ostream *local_e0;
  AutoFile file;
  uint8_t a [29];
  path local_88;
  path streams_test_filename;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::_M_append(&local_88,0x10,"streams_test_tmp");
  std::filesystem::__cxx11::path::path(&streams_test_filename.super_path,&local_88);
  std::filesystem::__cxx11::path::~path(&local_88);
  file_00 = fsbridge::fopen((char *)&streams_test_filename.super_path,"w+b");
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffff830;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffff828;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff838;
  AutoFile::AutoFile(&file,(FILE *)file_00,data_xor);
  cVar5 = '\0';
  do {
    bfbad.m_src = (AutoFile *)CONCAT71(bfbad.m_src._1_7_,cVar5);
    AutoFile::write(&file,(int)&bfbad,(void *)0x1,in_RCX);
    cVar5 = cVar5 + '\x01';
  } while (cVar5 != '(');
  AutoFile::seek(&file,0,0);
  BufferedFile::BufferedFile(&bfbad,&file,0x19,0x19);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x64d996;
  file_01.m_end = (iterator)0x10e;
  file_01.m_begin = (iterator)&local_1c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1d8,msg);
  local_118._0_8_ = local_118._0_8_ & 0xffffffffffffff00;
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = (lazy_ostream *)local_290;
  local_290._0_8_ = "false";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_1e0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_1e8,0x10e);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  if (bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  bfbad.nSrcPos = 0;
  bfbad.m_read_pos = 0;
  bfbad.nReadLimit = 0xffffffffffffffff;
  bfbad.nRewind = 10;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bfbad.m_src = &file;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x19);
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start + 0x19;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[9] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[10] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[3] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[4] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[5] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[6] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[7] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[8] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[9] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[10] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = 0;
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x64daf8;
  file_02.m_end = (iterator)0x116;
  file_02.m_begin = (iterator)&local_228;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_finish;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_238,
             msg_00);
  rVar10.super_class_property<bool>.value = (class_property<bool>)true;
  if (bfbad.m_read_pos == bfbad.nSrcPos) {
    _cVar11 = 0x64db1c;
    iVar2 = feof((FILE *)(bfbad.m_src)->m_file);
    rVar10.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
  }
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar10.super_class_property<bool>.value;
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = (lazy_ostream *)local_290;
  local_290._0_8_ = "!bf.eof()";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_240 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  sVar3 = 0x116;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_248,0x116);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x11a;
  file_03.m_begin = (iterator)&local_260;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_270,
             msg_01);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_120 = (undefined1  [8])&local_158;
  local_150 = (_func_int **)&i;
  a[0] = i == '\0';
  local_158._0_4_ = 0;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_e0 = (lazy_ostream *)&local_150;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389a40;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_013890c8;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  sVar3 = 0x11a;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xe8ac1e,(size_t)&local_140
             ,0x11a,&obj,"0",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x11c;
  file_04.m_begin = (iterator)&local_2a0;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2b0,
             msg_02);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  a[0] = i == '\x01';
  local_158 = (_func_int *)CONCAT44(local_158._4_4_,1);
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = (_func_int **)&i;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389a40;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])&local_158;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_013890c8;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xe8ac1e,(size_t)&local_140
             ,0x11c,&obj,"1",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x11f;
  file_05.m_begin = (iterator)&local_2c0;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2d0,
             msg_03);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_158 = (_func_int *)bfbad.m_read_pos;
  local_120 = (undefined1  [8])local_2d4;
  local_2d4 = (undefined1  [4])0x2;
  a[0] = bfbad.m_read_pos == 2;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = &local_158;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_01388f88;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xf1dbf3,(size_t)&local_140
             ,0x11f,&obj,"2U",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x64e06a;
  file_06.m_end = (iterator)0x122;
  file_06.m_begin = (iterator)&local_2e8;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2f8,
             msg_04);
  uVar4 = (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  bfbad.m_read_pos = 0;
  if (bfbad.nSrcPos >= uVar4) {
    bfbad.m_read_pos = bfbad.nSrcPos - uVar4;
  }
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(bfbad.nSrcPos < uVar4 || bfbad.nSrcPos - uVar4 == 0);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "bf.SetPos(0)";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_300 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  sVar3 = 0x122;
  local_e0 = (lazy_ostream *)local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_308,0x122);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x124;
  file_07.m_begin = (iterator)&local_318;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_328,
             msg_05);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  a[0] = i == '\0';
  local_158 = (_func_int *)((ulong)local_158 & 0xffffffff00000000);
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = (_func_int **)&i;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389a40;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])&local_158;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_013890c8;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xe8ac1e,(size_t)&local_140
             ,0x124,&obj,"0",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x64e2f8;
  file_08.m_end = (iterator)0x127;
  file_08.m_begin = (iterator)&local_338;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_348,
             msg_06);
  bfbad.m_read_pos = 2;
  if (1 >= bfbad.nSrcPos) {
    bfbad.m_read_pos = bfbad.nSrcPos;
  }
  bVar9 = bfbad.nSrcPos <=
          ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 2U;
  if (!bVar9) {
    bfbad.m_read_pos =
         bfbad.nSrcPos -
         ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bVar9 && 1 < bfbad.nSrcPos);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "bf.SetPos(2)";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_350 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  sVar3 = 0x127;
  local_e0 = (lazy_ostream *)local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_358,0x127);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x129;
  file_09.m_begin = (iterator)&local_368;
  msg_07.m_end = pvVar7;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_378,
             msg_07);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  a[0] = i == '\x02';
  local_158 = (_func_int *)CONCAT44(local_158._4_4_,2);
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = (_func_int **)&i;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389a40;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])&local_158;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_013890c8;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xe8ac1e,(size_t)&local_140
             ,0x129,&obj,"2",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x64e59e;
  file_10.m_end = (iterator)0x12f;
  file_10.m_begin = (iterator)&local_388;
  msg_08.m_end = pvVar7;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_398,
             msg_08);
  if (bfbad.m_read_pos < 4) {
    bfbad.nReadLimit = 3;
  }
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "bf.SetLimit(3)";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_3a0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  sVar3 = 0x12f;
  local_e0 = (lazy_ostream *)local_290;
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bfbad.m_read_pos < 4);
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_3a8,0x12f);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  BufferedFile::read(&bfbad,(int)&obj_4,(void *)0x1,sVar3);
  i = obj_4;
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x64e6bf;
  file_11.m_end = (iterator)0x132;
  file_11.m_begin = (iterator)&local_3b8;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3c8,
             msg_09);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "false";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_3d0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_e0 = (lazy_ostream *)local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_3d8,0x132);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x64e78c;
  file_12.m_end = (iterator)0x138;
  file_12.m_begin = (iterator)&local_418;
  msg_10.m_end = pvVar7;
  msg_10.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_428,
             msg_10);
  bfbad.nReadLimit = 0xffffffffffffffff;
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "bf.SetLimit()";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_430 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_e0 = (lazy_ostream *)local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_438,0x138);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x13a;
  file_13.m_begin = (iterator)&local_448;
  msg_11.m_end = pvVar7;
  msg_11.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_458,
             msg_11);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_158 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 3;
  local_2d4 = (undefined1  [4])0x3;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = &local_158;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])local_2d4;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_01388f88;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  sVar3 = 0x13a;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xf1dbf3,(size_t)&local_140
             ,0x13a,&obj,"3U",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_158._0_1_ = 3;
  do {
    BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
    i = obj;
    local_468 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_460 = "";
    local_478 = &boost::unit_test::basic_cstring<char_const>::null;
    local_470 = &boost::unit_test::basic_cstring<char_const>::null;
    file_14.m_end = (iterator)0x13f;
    file_14.m_begin = (iterator)&local_468;
    msg_12.m_end = pvVar7;
    msg_12.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_478,
               msg_12);
    local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
    local_290._0_8_ = &PTR__lazy_ostream_01388f08;
    local_280 = boost::unit_test::lazy_ostream::inst;
    local_278 = "";
    a[0] = i == (byte)local_158;
    a[8] = '\0';
    a[9] = '\0';
    a[10] = '\0';
    a[0xb] = '\0';
    a[0xc] = '\0';
    a[0xd] = '\0';
    a[0xe] = '\0';
    a[0xf] = '\0';
    a[0x10] = '\0';
    a[0x11] = '\0';
    a[0x12] = '\0';
    a[0x13] = '\0';
    a[0x14] = '\0';
    a[0x15] = '\0';
    a[0x16] = '\0';
    a[0x17] = '\0';
    local_140._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_140.m_message.px = (element_type *)0xf1d3b0;
    local_150 = (_func_int **)&i;
    local_f0 = false;
    _obj = &PTR__lazy_ostream_01389a40;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = (lazy_ostream *)&local_150;
    local_120 = (undefined1  [8])&local_158;
    local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
    local_118._0_8_ = &PTR__lazy_ostream_01389a40;
    local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_100 = (_func_int **)local_120;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    sVar3 = 0x13f;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xe8ac1e,
               (size_t)&local_140,0x13f,&obj,"j",&local_118);
    boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
    local_158._0_1_ = (byte)local_158 + 1;
  } while ((byte)local_158 < 10);
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x141;
  file_15.m_begin = (iterator)&local_488;
  msg_13.m_end = pvVar7;
  msg_13.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_498,
             msg_13);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_158 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 10;
  local_2d4 = (undefined1  [4])0xa;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = &local_158;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])local_2d4;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_01388f88;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xf1dbf3,(size_t)&local_140
             ,0x141,&obj,"10U",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x64ed4e;
  file_16.m_end = (iterator)0x144;
  file_16.m_begin = (iterator)&local_4a8;
  msg_14.m_end = pvVar7;
  msg_14.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4b8,
             msg_14);
  uVar4 = (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  bfbad.m_read_pos = 0;
  if (bfbad.nSrcPos >= uVar4) {
    bfbad.m_read_pos = bfbad.nSrcPos - uVar4;
  }
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(bfbad.nSrcPos < uVar4 || bfbad.nSrcPos - uVar4 == 0);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "bf.SetPos(0)";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_4c0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_e0 = (lazy_ostream *)local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_4c8,0x144);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x145;
  file_17.m_begin = (iterator)&local_4d8;
  msg_15.m_end = pvVar7;
  msg_15.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_4e8,
             msg_15);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_158 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 0;
  local_2d4 = (undefined1  [4])0x0;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = &local_158;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])local_2d4;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_01388f88;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  sVar3 = 0x145;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xf1dbf3,(size_t)&local_140
             ,0x145,(lazy_ostream *)&obj,"0U",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x147;
  file_18.m_begin = (iterator)&local_4f8;
  msg_16.m_end = pvVar7;
  msg_16.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_508,
             msg_16);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  a[0] = i == '\0';
  local_158 = (_func_int *)((ulong)local_158 & 0xffffffff00000000);
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = (_func_int **)&i;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389a40;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])&local_158;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_013890c8;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xe8ac1e,(size_t)&local_140
             ,0x147,&obj,"0",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x64f13f;
  file_19.m_end = (iterator)0x14c;
  file_19.m_begin = (iterator)&local_518;
  msg_17.m_end = pvVar7;
  msg_17.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_528,
             msg_17);
  bfbad.m_read_pos = 10;
  if (9 >= bfbad.nSrcPos) {
    bfbad.m_read_pos = bfbad.nSrcPos;
  }
  bVar9 = bfbad.nSrcPos <=
          ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 10U;
  if (!bVar9) {
    bfbad.m_read_pos =
         bfbad.nSrcPos -
         ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bVar9 && 9 < bfbad.nSrcPos);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "bf.SetPos(10)";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_530 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  sVar3 = 0x14c;
  local_e0 = (lazy_ostream *)local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_538,0x14c);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x14e;
  file_20.m_begin = (iterator)&local_548;
  msg_18.m_end = pvVar7;
  msg_18.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_558,
             msg_18);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  a[0] = i == '\n';
  local_158 = (_func_int *)CONCAT44(local_158._4_4_,10);
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = (_func_int **)&i;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389a40;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])&local_158;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_013890c8;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xe8ac1e,(size_t)&local_140
             ,0x14e,&obj,"10",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_568 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x14f;
  file_21.m_begin = (iterator)&local_568;
  msg_19.m_end = pvVar7;
  msg_19.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_578,
             msg_19);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_158 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 0xb;
  local_2d4 = (undefined1  [4])0xb;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = &local_158;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])local_2d4;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_01388f88;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xf1dbf3,(size_t)&local_140
             ,0x14f,&obj,"11U",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x64f551;
  file_22.m_end = (iterator)0x153;
  file_22.m_begin = (iterator)&local_588;
  msg_20.m_end = pvVar7;
  msg_20.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_598,
             msg_20);
  uVar4 = ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 1;
  bfbad.m_read_pos = (ulong)(bfbad.nSrcPos != 0);
  if (uVar4 < bfbad.nSrcPos) {
    bfbad.m_read_pos =
         bfbad.nSrcPos -
         ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bfbad.nSrcPos - 1 < uVar4);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "bf.SetPos(1)";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_5a0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_e0 = (lazy_ostream *)local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_5a8,0x153);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x154;
  file_23.m_begin = (iterator)&local_5b8;
  msg_21.m_end = pvVar7;
  msg_21.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_5c8,
             msg_21);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_158 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 1;
  local_2d4 = (undefined1  [4])0x1;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = &local_158;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])local_2d4;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_01388f88;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  sVar3 = 0x154;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xf1dbf3,(size_t)&local_140
             ,0x154,(lazy_ostream *)&obj,"1U",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x156;
  file_24.m_begin = (iterator)&local_5d8;
  msg_22.m_end = pvVar7;
  msg_22.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_5e8,
             msg_22);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  a[0] = i == '\x01';
  local_158 = (_func_int *)CONCAT44(local_158._4_4_,1);
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = (_func_int **)&i;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389a40;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])&local_158;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_013890c8;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xe8ac1e,(size_t)&local_140
             ,0x156,&obj,"1",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x64f95a;
  file_25.m_end = (iterator)0x15a;
  file_25.m_begin = (iterator)&local_5f8;
  msg_23.m_end = pvVar7;
  msg_23.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_608,
             msg_23);
  bfbad.m_read_pos = 0xb;
  if (10 >= bfbad.nSrcPos) {
    bfbad.m_read_pos = bfbad.nSrcPos;
  }
  bVar9 = bfbad.nSrcPos <=
          ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 0xbU;
  if (!bVar9) {
    bfbad.m_read_pos =
         bfbad.nSrcPos -
         ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bVar9 && 10 < bfbad.nSrcPos);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "bf.SetPos(11)";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_618 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_610 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  sVar3 = 0x15a;
  local_e0 = (lazy_ostream *)local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_618,0x15a);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  pp_Var8 = (_func_int **)a;
  BufferedFile::read(&bfbad,(int)pp_Var8,(void *)0x1d,sVar3);
  uVar4 = 0xb;
  do {
    local_628 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_620 = "";
    local_638 = &boost::unit_test::basic_cstring<char_const>::null;
    local_630 = &boost::unit_test::basic_cstring<char_const>::null;
    file_26.m_end = (iterator)0x15f;
    file_26.m_begin = (iterator)&local_628;
    msg_24.m_end = pvVar7;
    msg_24.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_638,
               msg_24);
    local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
    local_290._0_8_ = &PTR__lazy_ostream_01388f08;
    local_280 = boost::unit_test::lazy_ostream::inst;
    local_278 = "";
    local_2d4 = SUB84(uVar4,0);
    local_140.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(uVar4 == *(byte *)pp_Var8);
    local_140.m_message.px = (element_type *)0x0;
    local_140.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_150 = (_func_int **)0xf1d34a;
    local_148 = "";
    local_f0 = false;
    _obj = &PTR__lazy_ostream_01389a40;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = (lazy_ostream *)local_120;
    local_158 = (_func_int *)local_2d4;
    local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
    local_118._0_8_ = &PTR__lazy_ostream_013890c8;
    local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_100 = &local_158;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_120 = (undefined1  [8])pp_Var8;
    boost::test_tools::tt_detail::report_assertion
              (&local_140,(lazy_ostream *)local_290,1,2,REQUIRE,0xf1dcbd,(size_t)&local_150,0x15f,
               &obj,"11 + j",&local_118);
    boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
    pp_Var8 = (_func_int **)((long)pp_Var8 + 1);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x28);
  local_648 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_640 = "";
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x162;
  file_27.m_begin = (iterator)&local_648;
  msg_25.m_end = pvVar7;
  msg_25.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_658,
             msg_25);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_158 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 0x28;
  local_2d4 = (undefined1  [4])0x28;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = &local_158;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])local_2d4;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_01388f88;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  sVar3 = 0x162;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xf1dbf3,(size_t)&local_140
             ,0x162,&obj,"40U",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  BufferedFile::read(&bfbad,(int)&obj_9,(void *)0x1,sVar3);
  i = obj_9;
  local_668 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_660 = "";
  local_678 = &boost::unit_test::basic_cstring<char_const>::null;
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x64fdfe;
  file_28.m_end = (iterator)0x167;
  file_28.m_begin = (iterator)&local_668;
  msg_26.m_end = pvVar7;
  msg_26.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_678,
             msg_26);
  local_118._0_8_ = local_118._0_8_ & 0xffffffffffffff00;
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "false";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_680 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_e0 = (lazy_ostream *)local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_688,0x167);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_6c0 = "";
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x64fed2;
  file_29.m_end = (iterator)0x16d;
  file_29.m_begin = (iterator)&local_6c8;
  msg_27.m_end = pvVar7;
  msg_27.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_6d8,
             msg_27);
  if (bfbad.m_read_pos == bfbad.nSrcPos) {
    _cVar11 = 0x64fef4;
    iVar2 = feof((FILE *)(bfbad.m_src)->m_file);
    rVar10.super_class_property<bool>.value = (class_property<bool>)(iVar2 != 0);
  }
  else {
    rVar10.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar10.super_class_property<bool>.value;
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "bf.eof()";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_6e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_6e0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_e0 = (lazy_ostream *)local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_6e8,0x16d);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_6f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_6f0 = "";
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x170;
  file_30.m_begin = (iterator)&local_6f8;
  msg_28.m_end = pvVar7;
  msg_28.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_708,
             msg_28);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_158 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 0x28;
  local_2d4 = (undefined1  [4])0x28;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = &local_158;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])local_2d4;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_01388f88;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xf1dbf3,(size_t)&local_140
             ,0x170,(lazy_ostream *)&obj,"40U",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_718 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_710 = "";
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x65013c;
  file_31.m_end = (iterator)0x171;
  file_31.m_begin = (iterator)&local_718;
  msg_29.m_end = pvVar7;
  msg_29.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_728,
             msg_29);
  bfbad.m_read_pos = 0x1e;
  if (0x1d >= bfbad.nSrcPos) {
    bfbad.m_read_pos = bfbad.nSrcPos;
  }
  bVar9 = bfbad.nSrcPos <=
          ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 0x1eU;
  if (!bVar9) {
    bfbad.m_read_pos =
         bfbad.nSrcPos -
         ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bVar9 && 0x1d < bfbad.nSrcPos);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "bf.SetPos(30)";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_738 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_730 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  sVar3 = 0x171;
  local_e0 = (lazy_ostream *)local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_738,0x171);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_748 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_740 = "";
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x173;
  file_32.m_begin = (iterator)&local_748;
  msg_30.m_end = pvVar7;
  msg_30.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_758,
             msg_30);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  a[0] = i == '\x1e';
  local_158 = (_func_int *)CONCAT44(local_158._4_4_,0x1e);
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = (_func_int **)&i;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389a40;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])&local_158;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_013890c8;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xe8ac1e,(size_t)&local_140
             ,0x173,&obj,"30",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_768 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_760 = "";
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x174;
  file_33.m_begin = (iterator)&local_768;
  msg_31.m_end = pvVar7;
  msg_31.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_778,
             msg_31);
  local_290._8_8_ = local_290._8_8_ & 0xffffffffffffff00;
  local_290._0_8_ = &PTR__lazy_ostream_01388f08;
  local_280 = boost::unit_test::lazy_ostream::inst;
  local_278 = "";
  local_158 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 0x1f;
  local_2d4 = (undefined1  [4])0x1f;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_140._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_140.m_message.px = (element_type *)0xf1d3b0;
  local_150 = &local_158;
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01388f48;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)&local_150;
  local_120 = (undefined1  [8])local_2d4;
  local_118.m_message.px = (element_type *)((ulong)local_118.m_message.px & 0xffffffffffffff00);
  local_118._0_8_ = &PTR__lazy_ostream_01388f88;
  local_118.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_100 = (_func_int **)local_120;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_290,1,2,REQUIRE,0xf1dbf3,(size_t)&local_140
             ,0x174,&obj,"31U",&local_118);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_780 = "";
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x65053f;
  file_34.m_end = (iterator)0x177;
  file_34.m_begin = (iterator)&local_788;
  msg_32.m_end = pvVar7;
  msg_32.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_798,
             msg_32);
  uVar4 = (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  bfbad.m_read_pos = 0;
  if (uVar4 <= bfbad.nSrcPos) {
    bfbad.m_read_pos = bfbad.nSrcPos - uVar4;
  }
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "!bf.SetPos(0)";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_7a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_7a0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_e0 = (lazy_ostream *)local_290;
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(uVar4 <= bfbad.nSrcPos && bfbad.nSrcPos - uVar4 != 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_7a8,0x177);
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  local_7b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_7b0 = "";
  _cVar11 = 0x650628;
  file_35.m_end = (iterator)0x17a;
  file_35.m_begin = (iterator)&local_7b8;
  msg_33.m_end = pvVar7;
  msg_33.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,
             (size_t)&stack0xfffffffffffff838,msg_33);
  local_118.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bfbad.m_read_pos < 0x1f);
  local_118.m_message.px = (element_type *)0x0;
  local_118.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_290._0_8_ = "bf.GetPos() <= 30U";
  local_290._8_8_ = "";
  local_f0 = false;
  _obj = &PTR__lazy_ostream_01389048;
  local_e8 = boost::unit_test::lazy_ostream::inst;
  local_e0 = (lazy_ostream *)local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_118,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&stack0xfffffffffffff828,0x17a
            );
  boost::detail::shared_count::~shared_count(&local_118.m_message.pn);
  __stream = file.m_file;
  file.m_file = (FILE *)0x0;
  if (__stream != (FILE *)0x0) {
    fclose((FILE *)__stream);
  }
  std::filesystem::remove((path *)&streams_test_filename);
  if (bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  AutoFile::~AutoFile(&file);
  std::filesystem::__cxx11::path::~path(&streams_test_filename.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_buffered_file)
{
    fs::path streams_test_filename = m_args.GetDataDirBase() / "streams_test_tmp";
    AutoFile file{fsbridge::fopen(streams_test_filename, "w+b")};

    // The value at each offset is the offset.
    for (uint8_t j = 0; j < 40; ++j) {
        file << j;
    }
    file.seek(0, SEEK_SET);

    // The buffer size (second arg) must be greater than the rewind
    // amount (third arg).
    try {
        BufferedFile bfbad{file, 25, 25};
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                        "Rewind limit must be less than buffer size") != nullptr);
    }

    // The buffer is 25 bytes, allow rewinding 10 bytes.
    BufferedFile bf{file, 25, 10};
    BOOST_CHECK(!bf.eof());

    uint8_t i;
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 1);

    // After reading bytes 0 and 1, we're positioned at 2.
    BOOST_CHECK_EQUAL(bf.GetPos(), 2U);

    // Rewind to offset 0, ok (within the 10 byte window).
    BOOST_CHECK(bf.SetPos(0));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);

    // We can go forward to where we've been, but beyond may fail.
    BOOST_CHECK(bf.SetPos(2));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 2);

    // If you know the maximum number of bytes that should be
    // read to deserialize the variable, you can limit the read
    // extent. The current file offset is 3, so the following
    // SetLimit() allows zero bytes to be read.
    BOOST_CHECK(bf.SetLimit(3));
    try {
        bf >> i;
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                           "Attempt to position past buffer limit") != nullptr);
    }
    // The default argument removes the limit completely.
    BOOST_CHECK(bf.SetLimit());
    // The read position should still be at 3 (no change).
    BOOST_CHECK_EQUAL(bf.GetPos(), 3U);

    // Read from current offset, 3, forward until position 10.
    for (uint8_t j = 3; j < 10; ++j) {
        bf >> i;
        BOOST_CHECK_EQUAL(i, j);
    }
    BOOST_CHECK_EQUAL(bf.GetPos(), 10U);

    // We're guaranteed (just barely) to be able to rewind to zero.
    BOOST_CHECK(bf.SetPos(0));
    BOOST_CHECK_EQUAL(bf.GetPos(), 0U);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);

    // We can set the position forward again up to the farthest
    // into the stream we've been, but no farther. (Attempting
    // to go farther may succeed, but it's not guaranteed.)
    BOOST_CHECK(bf.SetPos(10));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 10);
    BOOST_CHECK_EQUAL(bf.GetPos(), 11U);

    // Now it's only guaranteed that we can rewind to offset 1
    // (current read position, 11, minus rewind amount, 10).
    BOOST_CHECK(bf.SetPos(1));
    BOOST_CHECK_EQUAL(bf.GetPos(), 1U);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 1);

    // We can stream into large variables, even larger than
    // the buffer size.
    BOOST_CHECK(bf.SetPos(11));
    {
        uint8_t a[40 - 11];
        bf >> a;
        for (uint8_t j = 0; j < sizeof(a); ++j) {
            BOOST_CHECK_EQUAL(a[j], 11 + j);
        }
    }
    BOOST_CHECK_EQUAL(bf.GetPos(), 40U);

    // We've read the entire file, the next read should throw.
    try {
        bf >> i;
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                        "BufferedFile::Fill: end of file") != nullptr);
    }
    // Attempting to read beyond the end sets the EOF indicator.
    BOOST_CHECK(bf.eof());

    // Still at offset 40, we can go back 10, to 30.
    BOOST_CHECK_EQUAL(bf.GetPos(), 40U);
    BOOST_CHECK(bf.SetPos(30));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 30);
    BOOST_CHECK_EQUAL(bf.GetPos(), 31U);

    // We're too far to rewind to position zero.
    BOOST_CHECK(!bf.SetPos(0));
    // But we should now be positioned at least as far back as allowed
    // by the rewind window (relative to our farthest read position, 40).
    BOOST_CHECK(bf.GetPos() <= 30U);

    // We can explicitly close the file, or the destructor will do it.
    file.fclose();

    fs::remove(streams_test_filename);
}